

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::DropDirectoryItem
          (cmComputeLinkInformation *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item
          )

{
  cmake *this_00;
  string *psVar1;
  string local_a0;
  cmAlphaNum local_80;
  cmAlphaNum local_50;
  
  this_00 = this->CMakeInstance;
  local_50.View_._M_len = 8;
  local_50.View_._M_str = "Target \"";
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  local_80.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_80.View_._M_len = psVar1->_M_string_length;
  cmStrCat<char[34],std::__cxx11::string,char[69]>
            (&local_a0,&local_50,&local_80,(char (*) [34])"\" requests linking to directory \"",
             &item->Value,
             (char (*) [69])"\".  Targets may link only to libraries.  CMake is dropping the item.")
  ;
  cmake::IssueMessage(this_00,WARNING,&local_a0,&item->Backtrace);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void cmComputeLinkInformation::DropDirectoryItem(BT<std::string> const& item)
{
  // A full path to a directory was found as a link item.  Warn the
  // user.
  this->CMakeInstance->IssueMessage(
    MessageType::WARNING,
    cmStrCat("Target \"", this->Target->GetName(),
             "\" requests linking to directory \"", item.Value,
             "\".  Targets may link only to libraries.  CMake is dropping "
             "the item."),
    item.Backtrace);
}